

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleSerialSimulationDataGenerator.cpp
# Opt level: O1

void __thiscall
SimpleSerialSimulationDataGenerator::CreateSerialByte(SimpleSerialSimulationDataGenerator *this)

{
  uint uVar1;
  BitState BVar2;
  int iVar3;
  
  uVar1 = this->mStringIndex + 1;
  if ((this->mSerialText)._M_string_length == (ulong)uVar1) {
    uVar1 = 0;
  }
  this->mStringIndex = uVar1;
  BVar2 = (int)this + 0x38;
  SimulationChannelDescriptor::Advance(BVar2);
  SimulationChannelDescriptor::Transition();
  SimulationChannelDescriptor::Advance(BVar2);
  iVar3 = 8;
  do {
    SimulationChannelDescriptor::TransitionIfNeeded(BVar2);
    SimulationChannelDescriptor::Advance(BVar2);
    iVar3 = iVar3 + -1;
  } while (iVar3 != 0);
  SimulationChannelDescriptor::TransitionIfNeeded(BVar2);
  SimulationChannelDescriptor::Advance(BVar2);
  return;
}

Assistant:

void SimpleSerialSimulationDataGenerator::CreateSerialByte()
{
	U32 samples_per_bit = mSimulationSampleRateHz / mSettings->mBitRate;

	U8 byte = mSerialText[ mStringIndex ];
	mStringIndex++;
	if( mStringIndex == mSerialText.size() )
		mStringIndex = 0;

	//we're currenty high
	//let's move forward a little
	mSerialSimulationData.Advance( samples_per_bit * 10 );

	mSerialSimulationData.Transition();  //low-going edge for start bit
	mSerialSimulationData.Advance( samples_per_bit );  //add start bit time

	U8 mask = 0x1 << 7;
	for( U32 i=0; i<8; i++ )
	{
		if( ( byte & mask ) != 0 )
			mSerialSimulationData.TransitionIfNeeded( BIT_HIGH );
		else
			mSerialSimulationData.TransitionIfNeeded( BIT_LOW );

		mSerialSimulationData.Advance( samples_per_bit );
		mask = mask >> 1;
	}

	mSerialSimulationData.TransitionIfNeeded( BIT_HIGH ); //we need to end high

	//lets pad the end a bit for the stop bit:
	mSerialSimulationData.Advance( samples_per_bit );
}